

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

Calendar * __thiscall icu_63::Calendar::operator=(Calendar *this,Calendar *right)

{
  undefined8 uVar1;
  UBool UVar2;
  UBool UVar3;
  UBool UVar4;
  UCalendarWallTimeOption UVar5;
  int32_t iVar6;
  UCalendarDaysOfWeek UVar7;
  int32_t iVar8;
  int iVar9;
  undefined4 extraout_var;
  long lVar10;
  int32_t *piVar11;
  int32_t *piVar12;
  
  if (this != right) {
    piVar11 = right->fFields;
    piVar12 = this->fFields;
    for (lVar10 = 0x17; lVar10 != 0; lVar10 = lVar10 + -1) {
      *piVar12 = *piVar11;
      piVar11 = piVar11 + 1;
      piVar12 = piVar12 + 1;
    }
    *(undefined8 *)(this->fIsSet + 0xf) = *(undefined8 *)(right->fIsSet + 0xf);
    uVar1 = *(undefined8 *)(right->fIsSet + 8);
    *(undefined8 *)this->fIsSet = *(undefined8 *)right->fIsSet;
    *(undefined8 *)(this->fIsSet + 8) = uVar1;
    piVar11 = right->fStamp;
    piVar12 = this->fStamp;
    for (lVar10 = 0xb; lVar10 != 0; lVar10 = lVar10 + -1) {
      *(undefined8 *)piVar12 = *(undefined8 *)piVar11;
      piVar11 = piVar11 + 2;
      piVar12 = piVar12 + 2;
    }
    this->fStamp[0x16] = right->fStamp[0x16];
    this->fTime = right->fTime;
    UVar2 = right->fAreFieldsSet;
    UVar3 = right->fAreAllFieldsSet;
    UVar4 = right->fAreFieldsVirtuallySet;
    this->fIsTimeSet = right->fIsTimeSet;
    this->fAreFieldsSet = UVar2;
    this->fAreAllFieldsSet = UVar3;
    this->fAreFieldsVirtuallySet = UVar4;
    this->fLenient = right->fLenient;
    UVar5 = right->fSkippedWallTime;
    this->fRepeatedWallTime = right->fRepeatedWallTime;
    this->fSkippedWallTime = UVar5;
    if (this->fZone != (TimeZone *)0x0) {
      (*(this->fZone->super_UObject)._vptr_UObject[1])();
    }
    this->fZone = (TimeZone *)0x0;
    if (right->fZone != (TimeZone *)0x0) {
      iVar9 = (*(right->fZone->super_UObject)._vptr_UObject[0xc])();
      this->fZone = (TimeZone *)CONCAT44(extraout_var,iVar9);
    }
    this->fFirstDayOfWeek = right->fFirstDayOfWeek;
    this->fMinimalDaysInFirstWeek = right->fMinimalDaysInFirstWeek;
    iVar6 = right->fWeekendOnsetMillis;
    UVar7 = right->fWeekendCease;
    iVar8 = right->fWeekendCeaseMillis;
    this->fWeekendOnset = right->fWeekendOnset;
    this->fWeekendOnsetMillis = iVar6;
    this->fWeekendCease = UVar7;
    this->fWeekendCeaseMillis = iVar8;
    this->fNextStamp = right->fNextStamp;
    strncpy(this->validLocale,right->validLocale,0x9d);
    strncpy(this->actualLocale,right->actualLocale,0x9d);
    this->validLocale[0x9c] = '\0';
    this->actualLocale[0x9c] = '\0';
  }
  return this;
}

Assistant:

Calendar &
Calendar::operator=(const Calendar &right)
{
    if (this != &right) {
        uprv_arrayCopy(right.fFields, fFields, UCAL_FIELD_COUNT);
        uprv_arrayCopy(right.fIsSet, fIsSet, UCAL_FIELD_COUNT);
        uprv_arrayCopy(right.fStamp, fStamp, UCAL_FIELD_COUNT);
        fTime                    = right.fTime;
        fIsTimeSet               = right.fIsTimeSet;
        fAreAllFieldsSet         = right.fAreAllFieldsSet;
        fAreFieldsSet            = right.fAreFieldsSet;
        fAreFieldsVirtuallySet   = right.fAreFieldsVirtuallySet;
        fLenient                 = right.fLenient;
        fRepeatedWallTime        = right.fRepeatedWallTime;
        fSkippedWallTime         = right.fSkippedWallTime;
        delete fZone;
        fZone = NULL;
        if (right.fZone != NULL) {
            fZone                = right.fZone->clone();
        }
        fFirstDayOfWeek          = right.fFirstDayOfWeek;
        fMinimalDaysInFirstWeek  = right.fMinimalDaysInFirstWeek;
        fWeekendOnset            = right.fWeekendOnset;
        fWeekendOnsetMillis      = right.fWeekendOnsetMillis;
        fWeekendCease            = right.fWeekendCease;
        fWeekendCeaseMillis      = right.fWeekendCeaseMillis;
        fNextStamp               = right.fNextStamp;
        uprv_strncpy(validLocale, right.validLocale, sizeof(validLocale));
        uprv_strncpy(actualLocale, right.actualLocale, sizeof(actualLocale));
        validLocale[sizeof(validLocale)-1] = 0;
        actualLocale[sizeof(validLocale)-1] = 0;
    }

    return *this;
}